

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

UChar32 utf8IteratorPrevious(UCharIterator *iter)

{
  byte bVar1;
  int iVar2;
  int local_30;
  uint local_2c;
  UChar32 c;
  uint8_t *s;
  UChar lead;
  int32_t index;
  UCharIterator *iter_local;
  
  if (iter->reservedField == 0) {
    if (iter->start < 1) {
      iter_local._4_4_ = 0xffffffff;
    }
    else {
      iVar2 = iter->start + -1;
      iter->start = iVar2;
      bVar1 = *(byte *)((long)iter->context + (long)iVar2);
      local_2c = (uint)bVar1;
      if ((bVar1 & 0x80) != 0) {
        local_2c = utf8_prevCharSafeBody_63((uint8_t *)iter->context,0,&iter->start,local_2c,-3);
      }
      if (iter->index < 1) {
        if (iter->start < 2) {
          if ((int)local_2c < 0x10000) {
            local_30 = iter->start;
          }
          else {
            local_30 = iter->start + 1;
          }
          iter->index = local_30;
        }
      }
      else {
        iter->index = iter->index + -1;
      }
      if ((int)local_2c < 0x10000) {
        iter_local._4_4_ = local_2c;
      }
      else {
        iter->start = iter->start + 4;
        iter->reservedField = local_2c;
        iter_local._4_4_ = local_2c & 0x3ff | 0xdc00;
      }
    }
  }
  else {
    iVar2 = iter->reservedField;
    iter->reservedField = 0;
    iter->start = iter->start + -4;
    if (0 < iter->index) {
      iter->index = iter->index + -1;
    }
    iter_local._4_4_ = (uint)(ushort)((short)(iVar2 >> 10) + 0xd7c0);
  }
  return iter_local._4_4_;
}

Assistant:

static UChar32 U_CALLCONV
utf8IteratorPrevious(UCharIterator *iter) {
    int32_t index;

    if(iter->reservedField!=0) {
        UChar lead=U16_LEAD(iter->reservedField);
        iter->reservedField=0;
        iter->start-=4; /* we stayed behind the supplementary code point; go before it now */
        if((index=iter->index)>0) {
            iter->index=index-1;
        }
        return lead;
    } else if(iter->start>0) {
        const uint8_t *s=(const uint8_t *)iter->context;
        UChar32 c;

        U8_PREV_OR_FFFD(s, 0, iter->start, c);
        if((index=iter->index)>0) {
            iter->index=index-1;
        } else if(iter->start<=1) {
            iter->index= c<=0xffff ? iter->start : iter->start+1;
        }
        if(c<=0xffff) {
            return c;
        } else {
            iter->start+=4; /* back to behind this supplementary code point for consistent state */
            iter->reservedField=c;
            return U16_TRAIL(c);
        }
    } else {
        return U_SENTINEL;
    }
}